

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttbdf.c
# Opt level: O3

FT_Error tt_face_find_bdf_prop(TT_Face face,char *property_name,BDF_PropertyRec *aprop)

{
  TT_BDFRec *pbytes;
  byte bVar1;
  byte bVar2;
  FT_UInt FVar3;
  FT_Size pFVar4;
  FT_Stream stream;
  ushort *puVar5;
  FT_Error FVar6;
  int iVar7;
  size_t sVar8;
  void *pvVar9;
  ulong uVar10;
  ushort uVar11;
  uint uVar12;
  ulong __n;
  byte bVar13;
  FT_Byte *pFVar14;
  long lVar15;
  ushort *puVar16;
  ulong uVar17;
  FT_Byte *pFVar18;
  ulong local_38;
  
  pbytes = &face->bdf;
  pFVar4 = (face->root).size;
  aprop->type = BDF_PROPERTY_TYPE_NONE;
  if ((face->bdf).loaded != '\0') {
LAB_0024a759:
    if (property_name == (char *)0x0 || pFVar4 == (FT_Size)0x0) {
      return 6;
    }
    FVar3 = (face->bdf).num_strikes;
    sVar8 = strlen(property_name);
    if (FVar3 != 0 && sVar8 != 0) {
      pFVar14 = pbytes->table;
      pFVar18 = pFVar14 + (ulong)(FVar3 * 4) + 8;
      lVar15 = 0;
      do {
        bVar1 = pFVar14[lVar15 * 4 + 10];
        bVar2 = pFVar14[lVar15 * 4 + 0xb];
        uVar11 = CONCAT11(bVar1,bVar2);
        if ((ushort)(*(ushort *)(pFVar14 + lVar15 * 4 + 8) << 8 |
                    *(ushort *)(pFVar14 + lVar15 * 4 + 8) >> 8) == (pFVar4->metrics).y_ppem) {
          if (uVar11 == 0) {
            return 6;
          }
          lVar15 = 0;
          goto LAB_0024a960;
        }
        pFVar18 = pFVar18 + (uint)uVar11 * 10;
        lVar15 = lVar15 + 1;
      } while (FVar3 != (FT_UInt)lVar15);
    }
    return 6;
  }
  stream = (face->root).stream;
  (face->bdf).strings = (FT_Byte *)0x0;
  (face->bdf).strings_size = 0;
  pbytes->table = (FT_Byte *)0x0;
  (face->bdf).table_end = (FT_Byte *)0x0;
  (face->bdf).num_strikes = 0;
  (face->bdf).loaded = '\0';
  *(undefined3 *)&(face->bdf).field_0x25 = 0;
  FVar6 = tt_face_goto_table(face,0x42444620,stream,&local_38);
  if (local_38 < 8 || FVar6 != 0) {
    return 8;
  }
  FVar6 = FT_Stream_ExtractFrame(stream,local_38,&pbytes->table);
  if (FVar6 != 0) {
    return 8;
  }
  puVar5 = (ushort *)(face->bdf).table;
  (face->bdf).table_end = (FT_Byte *)((long)puVar5 + local_38);
  if ((ushort)(*puVar5 << 8 | *puVar5 >> 8) == 1) {
    uVar12 = *(uint *)(puVar5 + 2);
    uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
    uVar10 = (ulong)uVar12;
    if (7 < uVar12) {
      uVar11 = puVar5[1] << 8 | puVar5[1] >> 8;
      if ((uVar10 <= local_38 && local_38 - uVar10 != 0) && (ulong)uVar11 <= uVar10 - 8 >> 2) {
        (face->bdf).num_strikes = (uint)uVar11;
        (face->bdf).strings = (FT_Byte *)(uVar10 + (long)puVar5);
        (face->bdf).strings_size = local_38 - uVar10;
        puVar16 = puVar5 + (ulong)uVar11 * 2 + 4;
        if (uVar11 != 0) {
          lVar15 = 0;
          do {
            puVar16 = puVar16 + (ulong)(ushort)(puVar5[lVar15 * 2 + 5] << 8 |
                                               puVar5[lVar15 * 2 + 5] >> 8) * 5;
            lVar15 = lVar15 + 1;
          } while ((uint)uVar11 != (uint)lVar15);
        }
        if (puVar16 <= (ushort *)(uVar10 + (long)puVar5)) {
          (face->bdf).loaded = '\x01';
          goto LAB_0024a759;
        }
      }
    }
  }
  FT_Stream_ReleaseFrame(stream,&pbytes->table);
  (face->bdf).strings = (FT_Byte *)0x0;
  (face->bdf).strings_size = 0;
  pbytes->table = (FT_Byte *)0x0;
  (face->bdf).table_end = (FT_Byte *)0x0;
  (face->bdf).num_strikes = 0;
  (face->bdf).loaded = '\0';
  *(undefined3 *)&(face->bdf).field_0x25 = 0;
  return 8;
LAB_0024a960:
  bVar13 = pFVar18[lVar15 + 5];
  if ((bVar13 & 0x10) != 0) {
    uVar12 = *(uint *)(pFVar18 + lVar15);
    uVar17 = (ulong)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                    uVar12 << 0x18);
    uVar10 = (face->bdf).strings_size;
    __n = uVar10 - uVar17;
    if ((uVar17 <= uVar10 && __n != 0) && (sVar8 < __n)) {
      uVar12 = *(uint *)(pFVar18 + lVar15 + 6);
      pFVar14 = (face->bdf).strings;
      iVar7 = strncmp(property_name,(char *)(pFVar14 + uVar17),__n);
      if (iVar7 == 0) {
        uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18
        ;
        bVar13 = bVar13 & 0xf;
        if (bVar13 < 2) {
          if (uVar12 < uVar10) {
            pFVar14 = pFVar14 + uVar12;
            pvVar9 = memchr(pFVar14,0,uVar10);
            if (pvVar9 != (void *)0x0) {
              aprop->type = BDF_PROPERTY_TYPE_ATOM;
              (aprop->u).atom = (char *)pFVar14;
              return 0;
            }
          }
        }
        else {
          if (bVar13 == 2) {
            aprop->type = BDF_PROPERTY_TYPE_INTEGER;
LAB_0024aa3a:
            (aprop->u).cardinal = uVar12;
            return 0;
          }
          if (bVar13 == 3) {
            aprop->type = BDF_PROPERTY_TYPE_CARDINAL;
            goto LAB_0024aa3a;
          }
        }
      }
    }
  }
  lVar15 = lVar15 + 10;
  if ((uint)bVar1 * 0xa00 + (uint)bVar2 * 10 == (int)lVar15) {
    return 6;
  }
  goto LAB_0024a960;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_find_bdf_prop( TT_Face           face,
                         const char*       property_name,
                         BDF_PropertyRec  *aprop )
  {
    TT_BDF     bdf   = &face->bdf;
    FT_Size    size  = FT_FACE( face )->size;
    FT_Error   error = FT_Err_Ok;
    FT_Byte*   p;
    FT_UInt    count;
    FT_Byte*   strike;
    FT_Offset  property_len;


    aprop->type = BDF_PROPERTY_TYPE_NONE;

    if ( bdf->loaded == 0 )
    {
      error = tt_face_load_bdf_props( face, FT_FACE( face )->stream );
      if ( error )
        goto Exit;
    }

    count  = bdf->num_strikes;
    p      = bdf->table + 8;
    strike = p + 4 * count;

    error = FT_ERR( Invalid_Argument );

    if ( !size || !property_name )
      goto Exit;

    property_len = ft_strlen( property_name );
    if ( property_len == 0 )
      goto Exit;

    for ( ; count > 0; count-- )
    {
      FT_UInt  _ppem  = FT_NEXT_USHORT( p );
      FT_UInt  _count = FT_NEXT_USHORT( p );


      if ( _ppem == size->metrics.y_ppem )
      {
        count = _count;
        goto FoundStrike;
      }

      strike += 10 * _count;
    }
    goto Exit;

  FoundStrike:
    p = strike;
    for ( ; count > 0; count-- )
    {
      FT_UInt  type = FT_PEEK_USHORT( p + 4 );


      if ( ( type & 0x10 ) != 0 )
      {
        FT_UInt32  name_offset = FT_PEEK_ULONG( p     );
        FT_UInt32  value       = FT_PEEK_ULONG( p + 6 );

        /* be a bit paranoid for invalid entries here */
        if ( name_offset < bdf->strings_size                    &&
             property_len < bdf->strings_size - name_offset     &&
             ft_strncmp( property_name,
                         (const char*)bdf->strings + name_offset,
                         bdf->strings_size - name_offset ) == 0 )
        {
          switch ( type & 0x0F )
          {
          case 0x00:  /* string */
          case 0x01:  /* atoms */
            /* check that the content is really 0-terminated */
            if ( value < bdf->strings_size &&
                 ft_memchr( bdf->strings + value, 0, bdf->strings_size ) )
            {
              aprop->type   = BDF_PROPERTY_TYPE_ATOM;
              aprop->u.atom = (const char*)bdf->strings + value;
              error         = FT_Err_Ok;
              goto Exit;
            }
            break;

          case 0x02:
            aprop->type      = BDF_PROPERTY_TYPE_INTEGER;
            aprop->u.integer = (FT_Int32)value;
            error            = FT_Err_Ok;
            goto Exit;

          case 0x03:
            aprop->type       = BDF_PROPERTY_TYPE_CARDINAL;
            aprop->u.cardinal = value;
            error             = FT_Err_Ok;
            goto Exit;

          default:
            ;
          }
        }
      }
      p += 10;
    }

  Exit:
    return error;
  }